

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_compositions.h
# Opt level: O0

SeriesMatcher * __thiscall
icu_63::numparse::impl::SeriesMatcher::operator=(SeriesMatcher *this,SeriesMatcher *param_1)

{
  SeriesMatcher *param_1_local;
  SeriesMatcher *this_local;
  
  CompositionMatcher::operator=(&this->super_CompositionMatcher,&param_1->super_CompositionMatcher);
  return this;
}

Assistant:

class U_I18N_API SeriesMatcher : public CompositionMatcher {
  public:
    bool match(StringSegment& segment, ParsedNumber& result, UErrorCode& status) const override;

    bool smokeTest(const StringSegment& segment) const override;

    void postProcess(ParsedNumber& result) const override;

    virtual int32_t length() const = 0;

  protected:
    // No construction except by subclasses!
    SeriesMatcher() = default;
}